

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O2

string * __thiscall
Test::Formats::internal::utf16_to_string_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char16_t *ptr,size_t length)

{
  uint uVar1;
  uint32_t code;
  size_t i;
  char16_t *pcVar2;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (NATIVE_UTF8) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_70,(size_type)ptr);
    uVar1 = 0;
    for (pcVar2 = (char16_t *)0x0; ptr != pcVar2; pcVar2 = (char16_t *)((long)pcVar2 + 1)) {
      code = (uint32_t)*(ushort *)(this + (long)pcVar2 * 2);
      if ((code & 0xfc00) == 0xdc00) {
        code = *(ushort *)(this + (long)pcVar2 * 2) & 0x3ff | uVar1;
LAB_001226d1:
        uVar1 = 0;
        appendAsUtf8(code,&local_70);
      }
      else {
        if ((code & 0xfc00) != 0xd800) goto LAB_001226d1;
        uVar1 = (code & 0x3ff) * 0x400 + 0x10000;
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              (&local_70);
    std::operator+(&local_50,"\'",&local_70);
    std::operator+(__return_storage_ptr__,&local_50,"\'");
    std::__cxx11::string::~string(&local_50);
    std::__cxx11::string::~string(&local_70);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"(unknown encoding)",(allocator<char> *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::internal::utf16_to_string(const char16_t *ptr, std::size_t length) {
  if (NATIVE_UTF8) {
    // Convert UTF-16 to UTF-8
    std::string result{};
    result.reserve(length);

    uint32_t code = 0;
    for (std::size_t i = 0; i < length; ++i) {
      auto val = static_cast<uint16_t>(ptr[i]);
      if ((val & 0xFC00) == 0xD800) {
        code = (val & 0x03FFU) << 10;
        code += 0x10000;
        continue;
      } else if ((val & 0xFC00) == 0xDC00) {
        code |= (val & 0x03FFU);
      } else {
        code = val;
      }
      appendAsUtf8(code, result);
      code = 0;
    }

    result.shrink_to_fit();
    return "'" + result + "'";
  }
#ifdef _MSC_VER
  std::mbstate_t state{};
  std::string result;
  for (std::size_t i = 0; i < length; ++i) {
    std::array<char, MB_LEN_MAX> tmp{};
    std::size_t rc = std::c16rtomb(tmp.data(), ptr[i], &state);
    if (rc == static_cast<std::size_t>(-1)) {
      result.push_back('?');
      state = std::mbstate_t{};
      rc = 0;
    }
    for (std::size_t i = 0; i < rc; ++i) {
      result.push_back(tmp[i]);
    }
  }
  return "'" + result + "'";
#else
  return "(unknown encoding)";
#endif
}